

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O0

void xmlSAX2AttributeNs(xmlParserCtxtPtr ctxt,xmlChar *localname,xmlChar *prefix,xmlChar *value,
                       xmlChar *valueend)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  xmlChar *pxVar4;
  xmlRegisterNodeFunc *pp_Var5;
  xmlNodePtr pxVar6;
  xmlChar **name;
  xmlAttrPtr pxVar7;
  xmlChar *content;
  xmlChar *fullname;
  xmlChar fn [50];
  xmlChar *nvalnorm;
  xmlNodePtr tmp_1;
  xmlNodePtr tmp;
  xmlAttrPtr prev;
  xmlChar *dup;
  xmlNsPtr namespace;
  xmlAttrPtr ret;
  xmlChar *valueend_local;
  xmlChar *value_local;
  xmlChar *prefix_local;
  xmlChar *localname_local;
  xmlParserCtxtPtr ctxt_local;
  
  dup = (xmlChar *)0x0;
  prev = (xmlAttrPtr)0x0;
  if (prefix != (xmlChar *)0x0) {
    dup = (xmlChar *)xmlSearchNs(ctxt->myDoc,ctxt->node,prefix);
  }
  if (ctxt->freeAttrs == (xmlAttrPtr)0x0) {
    if (ctxt->dictNames == 0) {
      namespace = (xmlNsPtr)xmlNewNsProp(ctxt->node,(xmlNsPtr)dup,localname,(xmlChar *)0x0);
    }
    else {
      namespace = (xmlNsPtr)xmlNewNsPropEatName(ctxt->node,(xmlNsPtr)dup,localname,(xmlChar *)0x0);
    }
    if (namespace == (xmlNsPtr)0x0) {
      xmlErrMemory(ctxt,"xmlSAX2AttributeNs");
      return;
    }
  }
  else {
    namespace = (xmlNsPtr)ctxt->freeAttrs;
    ctxt->freeAttrs = (xmlAttrPtr)((xmlNodePtr)namespace)->next;
    ctxt->freeAttrsNr = ctxt->freeAttrsNr + -1;
    memset(namespace,0,0x60);
    ((xmlNodePtr)namespace)->type = XML_ATTRIBUTE_NODE;
    ((xmlNodePtr)namespace)->parent = ctxt->node;
    ((xmlNodePtr)namespace)->doc = ctxt->myDoc;
    ((xmlNodePtr)namespace)->ns = (xmlNs *)dup;
    if (ctxt->dictNames == 0) {
      pxVar4 = xmlStrdup(localname);
      ((xmlNodePtr)namespace)->name = pxVar4;
    }
    else {
      ((xmlNodePtr)namespace)->name = localname;
    }
    if (ctxt->node->properties == (_xmlAttr *)0x0) {
      ctxt->node->properties = (_xmlAttr *)namespace;
    }
    else {
      for (tmp = (xmlNodePtr)ctxt->node->properties; tmp->next != (_xmlNode *)0x0; tmp = tmp->next)
      {
      }
      tmp->next = (_xmlNode *)namespace;
      ((xmlNodePtr)namespace)->prev = tmp;
    }
    if ((__xmlRegisterCallbacks != 0) &&
       (pp_Var5 = __xmlRegisterNodeDefaultValue(), *pp_Var5 != (xmlRegisterNodeFunc)0x0)) {
      pp_Var5 = __xmlRegisterNodeDefaultValue();
      (**pp_Var5)((xmlNodePtr)namespace);
    }
  }
  iVar3 = (int)valueend;
  iVar1 = (int)value;
  if ((ctxt->replaceEntities == 0) && (ctxt->html == 0)) {
    if (*valueend == '\0') {
      pxVar6 = xmlStringLenGetNodeList(ctxt->myDoc,value,iVar3 - iVar1);
      namespace->prefix = (xmlChar *)pxVar6;
      for (tmp_1 = (xmlNodePtr)namespace->prefix; tmp_1 != (xmlNodePtr)0x0; tmp_1 = tmp_1->next) {
        tmp_1->doc = (_xmlDoc *)namespace[1].href;
        tmp_1->parent = (_xmlNode *)namespace;
        if (tmp_1->next == (_xmlNode *)0x0) {
          namespace->_private = tmp_1;
        }
      }
    }
    else {
      pxVar6 = xmlSAX2TextNode(ctxt,value,iVar3 - iVar1);
      namespace->prefix = (xmlChar *)pxVar6;
      namespace->_private = pxVar6;
      if (pxVar6 != (xmlNodePtr)0x0) {
        pxVar6->doc = (_xmlDoc *)namespace[1].href;
        pxVar6->parent = (_xmlNode *)namespace;
      }
    }
  }
  else if (value != (xmlChar *)0x0) {
    pxVar6 = xmlSAX2TextNode(ctxt,value,iVar3 - iVar1);
    namespace->prefix = (xmlChar *)pxVar6;
    namespace->_private = pxVar6;
    if (pxVar6 != (xmlNodePtr)0x0) {
      pxVar6->doc = (_xmlDoc *)namespace[1].href;
      pxVar6->parent = (_xmlNode *)namespace;
    }
  }
  if ((((ctxt->html == 0) && (ctxt->validate != 0)) && (ctxt->wellFormed != 0)) &&
     ((ctxt->myDoc != (xmlDocPtr)0x0 && (ctxt->myDoc->intSubset != (_xmlDtd *)0x0)))) {
    if (ctxt->replaceEntities == 0) {
      prev = (xmlAttrPtr)xmlSAX2DecodeAttrEntities(ctxt,value,valueend);
      if (prev == (xmlAttrPtr)0x0) {
        if (*valueend == '\0') {
          uVar2 = xmlValidateOneAttribute
                            (&ctxt->vctxt,ctxt->myDoc,ctxt->node,(xmlAttrPtr)namespace,value);
          ctxt->valid = uVar2 & ctxt->valid;
        }
        else {
          prev = (xmlAttrPtr)xmlStrndup(value,iVar3 - iVar1);
          uVar2 = xmlValidateOneAttribute
                            (&ctxt->vctxt,ctxt->myDoc,ctxt->node,(xmlAttrPtr)namespace,
                             (xmlChar *)prev);
          ctxt->valid = uVar2 & ctxt->valid;
        }
      }
      else {
        if ((ctxt->attsSpecial != (xmlHashTablePtr)0x0) &&
           (name = (xmlChar **)xmlBuildQName(localname,prefix,(xmlChar *)&fullname,0x32),
           name != (xmlChar **)0x0)) {
          (ctxt->vctxt).valid = 1;
          pxVar7 = (xmlAttrPtr)
                   xmlValidCtxtNormalizeAttributeValue
                             (&ctxt->vctxt,ctxt->myDoc,ctxt->node,(xmlChar *)name,(xmlChar *)prev);
          if ((ctxt->vctxt).valid != 1) {
            ctxt->valid = 0;
          }
          if ((name != &fullname) && (name != (xmlChar **)localname)) {
            (*xmlFree)(name);
          }
          if (pxVar7 != (xmlAttrPtr)0x0) {
            (*xmlFree)(prev);
            prev = pxVar7;
          }
        }
        uVar2 = xmlValidateOneAttribute
                          (&ctxt->vctxt,ctxt->myDoc,ctxt->node,(xmlAttrPtr)namespace,(xmlChar *)prev
                          );
        ctxt->valid = uVar2 & ctxt->valid;
      }
    }
    else {
      prev = (xmlAttrPtr)xmlStrndup(value,iVar3 - iVar1);
      uVar2 = xmlValidateOneAttribute
                        (&ctxt->vctxt,ctxt->myDoc,ctxt->node,(xmlAttrPtr)namespace,(xmlChar *)prev);
      ctxt->valid = uVar2 & ctxt->valid;
    }
  }
  else if (((ctxt->loadsubset & 8U) == 0) &&
          ((((ctxt->replaceEntities == 0 && (ctxt->external != 2)) ||
            ((ctxt->replaceEntities != 0 && (ctxt->inSubset == 0)))) &&
           (((namespace->prefix != (xmlChar *)0x0 && (*(int *)(namespace->prefix + 8) == 3)) &&
            (*(long *)(namespace->prefix + 0x30) == 0)))))) {
    pxVar4 = *(xmlChar **)(namespace->prefix + 0x50);
    if ((((prefix == ctxt->str_xml) && (*localname == 'i')) && (localname[1] == 'd')) &&
       (localname[2] == '\0')) {
      iVar3 = xmlValidateNCName(pxVar4,1);
      if (iVar3 != 0) {
        xmlErrValid(ctxt,XML_DTD_XMLID_VALUE,"xml:id : attribute value %s is not an NCName\n",
                    (char *)pxVar4,(char *)0x0);
      }
      xmlAddID(&ctxt->vctxt,ctxt->myDoc,pxVar4,(xmlAttrPtr)namespace);
    }
    else {
      iVar3 = xmlIsID(ctxt->myDoc,ctxt->node,(xmlAttrPtr)namespace);
      if (iVar3 == 0) {
        iVar3 = xmlIsRef(ctxt->myDoc,ctxt->node,(xmlAttrPtr)namespace);
        if (iVar3 != 0) {
          xmlAddRef(&ctxt->vctxt,ctxt->myDoc,pxVar4,(xmlAttrPtr)namespace);
        }
      }
      else {
        xmlAddID(&ctxt->vctxt,ctxt->myDoc,pxVar4,(xmlAttrPtr)namespace);
      }
    }
  }
  if (prev != (xmlAttrPtr)0x0) {
    (*xmlFree)(prev);
  }
  return;
}

Assistant:

static void
xmlSAX2AttributeNs(xmlParserCtxtPtr ctxt,
                   const xmlChar * localname,
                   const xmlChar * prefix,
		   const xmlChar * value,
		   const xmlChar * valueend)
{
    xmlAttrPtr ret;
    xmlNsPtr namespace = NULL;
    xmlChar *dup = NULL;

    /*
     * Note: if prefix == NULL, the attribute is not in the default namespace
     */
    if (prefix != NULL)
	namespace = xmlSearchNs(ctxt->myDoc, ctxt->node, prefix);

    /*
     * allocate the node
     */
    if (ctxt->freeAttrs != NULL) {
        ret = ctxt->freeAttrs;
	ctxt->freeAttrs = ret->next;
	ctxt->freeAttrsNr--;
	memset(ret, 0, sizeof(xmlAttr));
	ret->type = XML_ATTRIBUTE_NODE;

	ret->parent = ctxt->node;
	ret->doc = ctxt->myDoc;
	ret->ns = namespace;

	if (ctxt->dictNames)
	    ret->name = localname;
	else
	    ret->name = xmlStrdup(localname);

        /* link at the end to preserve order, TODO speed up with a last */
	if (ctxt->node->properties == NULL) {
	    ctxt->node->properties = ret;
	} else {
	    xmlAttrPtr prev = ctxt->node->properties;

	    while (prev->next != NULL) prev = prev->next;
	    prev->next = ret;
	    ret->prev = prev;
	}

	if ((__xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	    xmlRegisterNodeDefaultValue((xmlNodePtr)ret);
    } else {
	if (ctxt->dictNames)
	    ret = xmlNewNsPropEatName(ctxt->node, namespace,
	                              (xmlChar *) localname, NULL);
	else
	    ret = xmlNewNsProp(ctxt->node, namespace, localname, NULL);
	if (ret == NULL) {
	    xmlErrMemory(ctxt, "xmlSAX2AttributeNs");
	    return;
	}
    }

    if ((ctxt->replaceEntities == 0) && (!ctxt->html)) {
	xmlNodePtr tmp;

	/*
	 * We know that if there is an entity reference, then
	 * the string has been dup'ed and terminates with 0
	 * otherwise with ' or "
	 */
	if (*valueend != 0) {
	    tmp = xmlSAX2TextNode(ctxt, value, valueend - value);
	    ret->children = tmp;
	    ret->last = tmp;
	    if (tmp != NULL) {
		tmp->doc = ret->doc;
		tmp->parent = (xmlNodePtr) ret;
	    }
	} else {
	    ret->children = xmlStringLenGetNodeList(ctxt->myDoc, value,
						    valueend - value);
	    tmp = ret->children;
	    while (tmp != NULL) {
	        tmp->doc = ret->doc;
		tmp->parent = (xmlNodePtr) ret;
		if (tmp->next == NULL)
		    ret->last = tmp;
		tmp = tmp->next;
	    }
	}
    } else if (value != NULL) {
	xmlNodePtr tmp;

	tmp = xmlSAX2TextNode(ctxt, value, valueend - value);
	ret->children = tmp;
	ret->last = tmp;
	if (tmp != NULL) {
	    tmp->doc = ret->doc;
	    tmp->parent = (xmlNodePtr) ret;
	}
    }

#ifdef LIBXML_VALID_ENABLED
    if ((!ctxt->html) && ctxt->validate && ctxt->wellFormed &&
        ctxt->myDoc && ctxt->myDoc->intSubset) {
	/*
	 * If we don't substitute entities, the validation should be
	 * done on a value with replaced entities anyway.
	 */
        if (!ctxt->replaceEntities) {
	    dup = xmlSAX2DecodeAttrEntities(ctxt, value, valueend);
	    if (dup == NULL) {
	        if (*valueend == 0) {
		    ctxt->valid &= xmlValidateOneAttribute(&ctxt->vctxt,
				    ctxt->myDoc, ctxt->node, ret, value);
		} else {
		    /*
		     * That should already be normalized.
		     * cheaper to finally allocate here than duplicate
		     * entry points in the full validation code
		     */
		    dup = xmlStrndup(value, valueend - value);

		    ctxt->valid &= xmlValidateOneAttribute(&ctxt->vctxt,
				    ctxt->myDoc, ctxt->node, ret, dup);
		}
	    } else {
	        /*
		 * dup now contains a string of the flattened attribute
		 * content with entities substituted. Check if we need to
		 * apply an extra layer of normalization.
		 * It need to be done twice ... it's an extra burden related
		 * to the ability to keep references in attributes
		 */
		if (ctxt->attsSpecial != NULL) {
		    xmlChar *nvalnorm;
		    xmlChar fn[50];
		    xmlChar *fullname;

		    fullname = xmlBuildQName(localname, prefix, fn, 50);
		    if (fullname != NULL) {
			ctxt->vctxt.valid = 1;
		        nvalnorm = xmlValidCtxtNormalizeAttributeValue(
			                 &ctxt->vctxt, ctxt->myDoc,
					 ctxt->node, fullname, dup);
			if (ctxt->vctxt.valid != 1)
			    ctxt->valid = 0;

			if ((fullname != fn) && (fullname != localname))
			    xmlFree(fullname);
			if (nvalnorm != NULL) {
			    xmlFree(dup);
			    dup = nvalnorm;
			}
		    }
		}

		ctxt->valid &= xmlValidateOneAttribute(&ctxt->vctxt,
			        ctxt->myDoc, ctxt->node, ret, dup);
	    }
	} else {
	    /*
	     * if entities already have been substituted, then
	     * the attribute as passed is already normalized
	     */
	    dup = xmlStrndup(value, valueend - value);

	    ctxt->valid &= xmlValidateOneAttribute(&ctxt->vctxt,
	                             ctxt->myDoc, ctxt->node, ret, dup);
	}
    } else
#endif /* LIBXML_VALID_ENABLED */
           if (((ctxt->loadsubset & XML_SKIP_IDS) == 0) &&
	       (((ctxt->replaceEntities == 0) && (ctxt->external != 2)) ||
	        ((ctxt->replaceEntities != 0) && (ctxt->inSubset == 0))) &&
               /* Don't create IDs containing entity references */
               (ret->children != NULL) &&
               (ret->children->type == XML_TEXT_NODE) &&
               (ret->children->next == NULL)) {
        xmlChar *content = ret->children->content;
        /*
	 * when validating, the ID registration is done at the attribute
	 * validation level. Otherwise we have to do specific handling here.
	 */
        if ((prefix == ctxt->str_xml) &&
	           (localname[0] == 'i') && (localname[1] == 'd') &&
		   (localname[2] == 0)) {
	    /*
	     * Add the xml:id value
	     *
	     * Open issue: normalization of the value.
	     */
#if defined(LIBXML_SAX1_ENABLED) || defined(LIBXML_HTML_ENABLED) || defined(LIBXML_WRITER_ENABLED) || defined(LIBXML_LEGACY_ENABLED)
#ifdef LIBXML_VALID_ENABLED
	    if (xmlValidateNCName(content, 1) != 0) {
	        xmlErrValid(ctxt, XML_DTD_XMLID_VALUE,
		      "xml:id : attribute value %s is not an NCName\n",
			    (const char *) content, NULL);
	    }
#endif
#endif
	    xmlAddID(&ctxt->vctxt, ctxt->myDoc, content, ret);
	} else if (xmlIsID(ctxt->myDoc, ctxt->node, ret)) {
	    xmlAddID(&ctxt->vctxt, ctxt->myDoc, content, ret);
	} else if (xmlIsRef(ctxt->myDoc, ctxt->node, ret)) {
	    xmlAddRef(&ctxt->vctxt, ctxt->myDoc, content, ret);
	}
    }
    if (dup != NULL)
	xmlFree(dup);
}